

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O1

Vector2f __thiscall Rml::Box::GetSize(Box *this,BoxArea area)

{
  code *pcVar1;
  Vector2f VVar2;
  bool bVar3;
  long lVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  Vector2f VVar8;
  
  if ((area == Auto) &&
     (bVar3 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                     ,0x3b), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  VVar8 = this->content;
  if ((int)area < 3) {
    lVar4 = (long)(int)area;
    pfVar5 = this->area_edges[lVar4] + 3;
    do {
      lVar4 = lVar4 + 1;
      fVar6 = *pfVar5 + pfVar5[-2] + VVar8.x;
      fVar7 = VVar8.y + (*(float (*) [4])(pfVar5 + -3))[0] + pfVar5[-1];
      pfVar5 = pfVar5 + 4;
      VVar8.y = fVar7;
      VVar8.x = fVar6;
    } while ((int)lVar4 != 3);
  }
  else {
    fVar6 = VVar8.x;
    fVar7 = VVar8.y;
  }
  VVar2.y = fVar7;
  VVar2.x = fVar6;
  return VVar2;
}

Assistant:

Vector2f Box::GetSize(BoxArea area) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	Vector2f area_size(content);
	for (int i = (int)area; i <= (int)BoxArea::Padding; i++)
	{
		area_size.x += (area_edges[i][(int)BoxEdge::Left] + area_edges[i][(int)BoxEdge::Right]);
		area_size.y += (area_edges[i][(int)BoxEdge::Top] + area_edges[i][(int)BoxEdge::Bottom]);
	}

	return area_size;
}